

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_R_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Stop_Freeze_R_PDU::GetAsString_abi_cxx11_(Stop_Freeze_R_PDU *this)

{
  long in_RSI;
  
  GetAsString_abi_cxx11_((KString *)this,(Stop_Freeze_R_PDU *)(in_RSI + -0x60));
  return;
}

Assistant:

KString Stop_Freeze_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Stop/Freeze-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Real World Time:\n"
       << IndentString( m_RealWorldTime.GetAsString(), 1 )
       << "\tReason:           " << GetEnumAsStringStopFreezeReason( m_ui8Reason )
       << "\n\tFrozen Behavior:  " << GetEnumAsStringFrozenBehavior( m_ui8FrozenBehaviour )
       << "\n" << Reliability_Header::GetAsString()
       << "\n\tRequest ID:       " << m_ui32RequestID
       << "\n";

    return ss.str();
}